

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O1

void Search::verify_active_csoaa
               (label *losses,v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_> *known,size_t t,
               float multiplier)

{
  wclass *pwVar1;
  wclass *pwVar2;
  ostream *poVar3;
  wclass *pwVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  
  fVar6 = (float)t;
  if (fVar6 < 0.0) {
    fVar6 = sqrtf(fVar6);
  }
  else {
    fVar6 = SQRT(fVar6);
  }
  pwVar1 = (losses->costs)._begin;
  pwVar2 = (losses->costs)._end;
  if (pwVar1 != pwVar2) {
    lVar5 = 0;
    do {
      if (((&known->_begin->second)[lVar5] == false) &&
         (fVar7 = *(float *)(*(long *)((long)&known->_begin->first + lVar5) + 8) -
                  *(float *)((long)&pwVar1->x + lVar5), fVar7 = fVar7 * fVar7,
         multiplier / fVar6 < fVar7)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"verify_active_csoaa failed: truth ",0x22);
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
        poVar3 = std::ostream::_M_insert<double>((double)*(float *)((long)&pwVar1->x + lVar5));
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,", known[",8);
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]=",2);
        poVar3 = std::ostream::_M_insert<double>
                           ((double)*(float *)(*(long *)((long)&known->_begin->first + lVar5) + 8));
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,", error=",8);
        poVar3 = std::ostream::_M_insert<double>((double)fVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," vs threshold ",0xe);
        poVar3 = std::ostream::_M_insert<double>((double)(multiplier / fVar6));
        std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
      }
      pwVar4 = (wclass *)((long)&pwVar1[1].x + lVar5);
      lVar5 = lVar5 + 0x10;
    } while (pwVar4 != pwVar2);
  }
  return;
}

Assistant:

void verify_active_csoaa(
    COST_SENSITIVE::label& losses, v_array<pair<CS::wclass&, bool>>& known, size_t t, float multiplier)
{
  float threshold = multiplier / sqrt((float)t);
  cdbg << "verify_active_csoaa, losses = [";
  for (COST_SENSITIVE::wclass& wc : losses.costs) cdbg << " " << wc.class_index << ":" << wc.x;
  cdbg << " ]" << endl;
  // cdbg_print_array("verify_active_csoaa,  known", known);
  size_t i = 0;
  for (COST_SENSITIVE::wclass& wc : losses.costs)
  {
    if (!known[i].second)
    {
      float err = pow(known[i].first.partial_prediction - wc.x, 2);
      if (err > threshold)
      {
        std::cerr << "verify_active_csoaa failed: truth " << wc.class_index << ":" << wc.x << ", known[" << i
                  << "]=" << known[i].first.partial_prediction << ", error=" << err << " vs threshold " << threshold
                  << endl;
      }
    }
    i++;
  }
}